

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O1

bool match_place_holder(Am_Value *placeholder_value,Am_Value *current_value)

{
  bool bVar1;
  ostream *poVar2;
  Am_Value *value;
  Am_Object placeholder;
  Am_Placeholder_Replace_Method method;
  Am_Object AStack_28;
  Am_Placeholder_Replace_Method local_20;
  
  Am_Object::Am_Object(&AStack_28,placeholder_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Matching placeholder ",0x17);
  poVar2 = operator<<((ostream *)&std::cout,&AStack_28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ostream::flush();
  value = Am_Object::Get(&AStack_28,Am_PLACEHOLDER_MATCH_METHOD,0);
  Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method(&local_20,value);
  if (local_20.Call != (Am_Placeholder_Replace_Method_Type *)0x0) {
    bVar1 = (*local_20.Call)(&AStack_28,current_value,&Am_No_Object);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  method ",9);
    poVar2 = operator<<((ostream *)&std::cout,&local_20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," returned ",10);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::ostream::flush();
    Am_Object::~Am_Object(&AStack_28);
    return bVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Placeholder ",0xc);
  poVar2 = operator<<((ostream *)&std::cerr,&AStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," has no match method.",0x15);
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error();
}

Assistant:

bool
match_place_holder(Am_Value &placeholder_value, Am_Value &current_value)
{
  Am_Object placeholder = placeholder_value;
  std::cout << "  Matching placeholder " << placeholder << std::endl
            << std::flush;
  Am_Placeholder_Replace_Method method =
      placeholder.Get(Am_PLACEHOLDER_MATCH_METHOD);
  if (!method.Valid())
    Am_ERROR("Placeholder " << placeholder << " has no match method.");
  bool match = method.Call(placeholder, current_value, Am_No_Object);
  std::cout << "  method " << method << " returned " << match << std::endl
            << std::flush;
  return match;
}